

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

int __thiscall ONX_Model::AddRenderEnvironment(ONX_Model *this,wchar_t *candidate_name)

{
  bool bVar1;
  Type TVar2;
  wchar_t *component_name;
  ON_ModelComponent *pOVar3;
  uint in_stack_fffffffffffffd0c;
  ON_RenderEnvironment *model_env;
  ON_ModelComponentReference mcr;
  ON_ComponentManifest local_278;
  ON_wString env_name;
  undefined1 local_260 [8];
  ON_RenderEnvironment env;
  wchar_t *candidate_name_local;
  ONX_Model *this_local;
  
  env.super_ON_RenderContent._PRIVATE._416_8_ = candidate_name;
  bVar1 = ON_ModelComponent::IsValidComponentName(candidate_name);
  if (bVar1) {
    ON_RenderEnvironment::ON_RenderEnvironment((ON_RenderEnvironment *)local_260);
    ON_RenderContent::SetTypeId
              ((ON_RenderContent *)local_260,&ON_RenderContentType_BasicEnvironment);
    TVar2 = ON_ModelComponent::ComponentType((ON_ModelComponent *)local_260);
    mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0;
    ON_ComponentManifest::UnusedName
              (&local_278,(char)this - 0x30,(ON_UUID)ZEXT116(TVar2),(wchar_t *)(uchar  [8])0x0,
               (wchar_t *)env.super_ON_RenderContent._PRIVATE._416_8_,(wchar_t *)0x0,0,
               (uint *)((ulong)in_stack_fffffffffffffd0c << 0x20));
    component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_278);
    ON_ModelComponent::SetName((ON_ModelComponent *)local_260,component_name);
    AddModelComponent((ONX_Model *)&model_env,(ON_ModelComponent *)this,SUB81(local_260,0));
    pOVar3 = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)&model_env);
    pOVar3 = (ON_ModelComponent *)ON_RenderEnvironment::Cast(&pOVar3->super_ON_Object);
    if (pOVar3 == (ON_ModelComponent *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
                 ,0x711,"","Failed to add render environment; AddModelComponent() failed");
      this_local._4_4_ = -0x7fffffff;
    }
    else {
      this_local._4_4_ = ON_ModelComponent::Index(pOVar3);
    }
    ON_ModelComponentReference::~ON_ModelComponentReference
              ((ON_ModelComponentReference *)&model_env);
    ON_wString::~ON_wString((ON_wString *)&local_278);
    ON_RenderEnvironment::~ON_RenderEnvironment((ON_RenderEnvironment *)local_260);
  }
  else {
    this_local._4_4_ = -0x7fffffff;
  }
  return this_local._4_4_;
}

Assistant:

int ONX_Model::AddRenderEnvironment(const wchar_t* candidate_name)
{
  if (!ON_ModelComponent::IsValidComponentName(candidate_name))
    return ON_UNSET_INT_INDEX;

  ON_RenderEnvironment env;
  env.SetTypeId(ON_RenderContentType_BasicEnvironment);

  const ON_wString env_name = m_manifest.UnusedName(env.ComponentType(), ON_nil_uuid, candidate_name,
                                                    nullptr, nullptr, 0, nullptr);
  env.SetName(env_name);

  const ON_ModelComponentReference mcr = AddModelComponent(env, true);
  const auto* model_env = ON_RenderEnvironment::Cast(mcr.ModelComponent());
  if (nullptr == model_env)
  {
    ON_ERROR("Failed to add render environment; AddModelComponent() failed");
    return ON_UNSET_INT_INDEX;
  }

  return model_env->Index();
}